

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::LocalRedundancyEliminationPass::Process(LocalRedundancyEliminationPass *this)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  pointer puVar3;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var4;
  undefined8 *puVar5;
  bool bVar6;
  pointer puVar7;
  byte bVar8;
  undefined8 *puVar9;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  ValueNumberTable vnTable;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_e0;
  ValueNumberTable local_b0;
  
  ValueNumberTable::ValueNumberTable(&local_b0,(this->super_Pass).context_);
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar2->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  p_Var1 = &local_e0._M_impl.super__Rb_tree_header;
  bVar8 = 0;
  for (puVar7 = *(pointer *)
                 &(pMVar2->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    _Var4.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar7->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    puVar5 = *(undefined8 **)
              ((long)_Var4.
                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                     .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0);
    for (puVar9 = *(undefined8 **)
                   ((long)_Var4.
                          super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                          .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                   0x98); puVar9 != puVar5; puVar9 = puVar9 + 1) {
      local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      bVar6 = EliminateRedundanciesInBB
                        (this,(BasicBlock *)*puVar9,&local_b0,
                         (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&local_e0);
      bVar8 = bVar8 | bVar6;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_e0);
    }
  }
  ValueNumberTable::~ValueNumberTable(&local_b0);
  return bVar8 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status LocalRedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    for (auto& bb : func) {
      // Keeps track of all ids that contain a given value number. We keep
      // track of multiple values because they could have the same value, but
      // different decorations.
      std::map<uint32_t, uint32_t> value_to_ids;
      if (EliminateRedundanciesInBB(&bb, vnTable, &value_to_ids))
        modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}